

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

int Sfm_ObjLevelNewR(Vec_Int_t *vArray,Vec_Int_t *vLevelsR,int fAddLevel)

{
  int iVar1;
  int iVar2;
  int i;
  
  iVar2 = 0;
  for (i = 0; i < vArray->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vArray,i);
    iVar1 = Vec_IntEntry(vLevelsR,iVar1);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
  }
  return iVar2 + fAddLevel;
}

Assistant:

static inline int Sfm_ObjLevelNewR( Vec_Int_t * vArray, Vec_Int_t * vLevelsR, int fAddLevel )
{
    int k, Fanout, LevelR = 0;
    Vec_IntForEachEntry( vArray, Fanout, k )
        LevelR = Abc_MaxInt( LevelR, Vec_IntEntry(vLevelsR, Fanout) );
    return LevelR + fAddLevel;
}